

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx
          (FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this,int i)

{
  undefined4 in_EDX;
  Fad<double> *in_RSI;
  Fad<Fad<double>_> *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffe8;
  Fad<double> *this_00;
  Fad<Fad<double>_> *e;
  
  this_00 = in_RSI;
  e = in_RDI;
  Fad<Fad<double>_>::dx(in_RDI,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  FadCst<double>::val((FadCst<double> *)&in_RSI->dx_);
  operator/<Fad<double>,_double,_nullptr>((Fad<double> *)e,(double)this_00);
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>
            (this_00,(FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *)
                     CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *)in_RSI);
  return (value_type *)in_RDI;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}